

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

bool __thiscall PEFile::_canAddNewSection(PEFile *this)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  long *local_40;
  size_t secCount;
  ExeNodeWrapper *sec;
  PEFile *this_local;
  
  iVar2 = (*(this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                    (&(this->super_MappedExe).super_ExeWrappersContainer,5);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    local_40 = (long *)0x0;
  }
  else {
    local_40 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar2),&ExeElementWrapper::typeinfo,
                                      &ExeNodeWrapper::typeinfo,0);
  }
  if ((local_40 != (long *)0x0) && (bVar1 = (**(code **)(*local_40 + 0x138))(), (bVar1 & 1) != 0)) {
    sVar3 = hdrSectionsNum(this);
    if (sVar3 == SectHdrsWrapper::SECT_COUNT_MAX) {
      return false;
    }
    return true;
  }
  return false;
}

Assistant:

bool PEFile::_canAddNewSection()
{
    ExeNodeWrapper* sec = dynamic_cast<ExeNodeWrapper*>(getWrapper(PEFile::WR_SECTIONS));
    if (sec == NULL || sec->canAddEntry() == false) {
        return false;
    }
    const size_t secCount = hdrSectionsNum();
    if (secCount == SectHdrsWrapper::SECT_COUNT_MAX) {
        return false; //limit exceeded
    }
    //TODO: some more checks? overlay?
    return true;
}